

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocket::startServerEncryption(QSslSocket *this)

{
  bool bVar1;
  QSslSocketPrivate *this_00;
  char *in_RDI;
  long in_FS_OFFSET;
  QSslSocketPrivate *d;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined4 in_stack_ffffffffffffff58;
  SslMode in_stack_ffffffffffffff5c;
  QSslSocketPrivate *in_stack_ffffffffffffff60;
  QSslSocketPrivate *this_01;
  char local_68 [32];
  char local_48 [32];
  undefined8 local_28;
  ulong local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSslSocket *)0x3a43f0);
  if (this_00->mode == UnencryptedMode) {
    bVar1 = supportsSsl();
    if (bVar1) {
      bVar1 = QSslSocketPrivate::verifyProtocolSupported(this_00,in_RDI);
      if (bVar1) {
        this_00->mode = SslServerMode;
        modeChanged((QSslSocket *)0x3a45a4,in_stack_ffffffffffffff5c);
        QSslSocketPrivate::startServerEncryption(in_stack_ffffffffffffff60);
      }
    }
    else {
      local_28 = 0xaaaaaaaaaaaaaaaa;
      local_20 = 0xaaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcSsl();
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_ffffffffffffff60,
                 (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_28), bVar1) {
        anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a44f2);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)this_00,in_RDI,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                   (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                   (char *)0x3a4508);
        QMessageLogger::warning
                  (local_68,"QSslSocket::startServerEncryption: TLS initialization failed");
        local_20 = local_20 & 0xffffffffffffff00;
      }
      this_01 = this_00;
      tr(in_RDI,(char *)this_00,in_stack_ffffffffffffff5c);
      QAbstractSocketPrivate::setErrorAndEmit
                ((QAbstractSocketPrivate *)this_01,(SocketError)((ulong)in_RDI >> 0x20),
                 (QString *)this_00);
      QString::~QString((QString *)0x3a4567);
    }
  }
  else {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    local_10 = 0xaaaaaaaaaaaaaaaa;
    QtPrivateLogging::lcSsl();
    anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)in_stack_ffffffffffffff60,
               (QLoggingCategory *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
      anon_unknown.dwarf_a87c06::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3a445a);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)this_00,in_RDI,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                 (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                 (char *)0x3a4470);
      QMessageLogger::warning
                (local_48,
                 "QSslSocket::startServerEncryption: cannot start handshake on non-plain connection"
                );
      local_10 = local_10 & 0xffffffffffffff00;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSslSocket::startServerEncryption()
{
    Q_D(QSslSocket);
    if (d->mode != UnencryptedMode) {
        qCWarning(lcSsl, "QSslSocket::startServerEncryption: cannot start handshake on non-plain connection");
        return;
    }
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::startServerEncryption()";
#endif
    if (!supportsSsl()) {
        qCWarning(lcSsl, "QSslSocket::startServerEncryption: TLS initialization failed");
        d->setErrorAndEmit(QAbstractSocket::SslInternalError, tr("TLS initialization failed"));
        return;
    }
    if (!d->verifyProtocolSupported("QSslSocket::startServerEncryption"))
        return;

    d->mode = SslServerMode;
    emit modeChanged(d->mode);
    d->startServerEncryption();
}